

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O2

void __thiscall Inline::CloneCallSequence(Inline *this,Instr *callInstr,Instr *clonedCallInstr)

{
  OpCode opcode;
  SymTable *this_00;
  code *pcVar1;
  bool bVar2;
  ArgSlot argSlotNum;
  StackSym *pSVar3;
  SymOpnd *pSVar4;
  Instr *this_01;
  Instr *pIVar5;
  Instr *pIVar6;
  Instr *pIVar7;
  Instr *local_40;
  undefined4 *local_38;
  
  pSVar3 = IR::Opnd::GetStackSym(callInstr->m_src2);
  pIVar5 = (pSVar3->field_5).m_instrDef;
  if ((pIVar5 != (Instr *)0x0 & pSVar3->field_0x18) == 1) {
    local_38 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    local_38 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *local_38 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                       ,0x1af,"(linkSym->IsSingleDef())","linkSym->IsSingleDef()");
    if (!bVar2) {
LAB_005038d7:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *local_38 = 0;
    pIVar5 = (pSVar3->field_5).m_instrDef;
  }
  pIVar6 = (Instr *)0x0;
  local_40 = clonedCallInstr;
  do {
    if ((pIVar5->m_src2 == (Opnd *)0x0) || (bVar2 = IR::Opnd::IsSymOpnd(pIVar5->m_src2), !bVar2)) {
      pIVar7 = (Instr *)0x0;
    }
    else {
      pSVar4 = IR::Opnd::AsSymOpnd(pIVar5->m_src2);
      pSVar3 = Sym::AsStackSym(pSVar4->m_sym);
      bVar2 = StackSym::IsArgSlotSym(pSVar3);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *local_38 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1b8,"(linkSym->IsArgSlotSym())","linkSym->IsArgSlotSym()");
        if (!bVar2) goto LAB_005038d7;
        *local_38 = 0;
      }
      if (((((pSVar3->field_0x18 & 1) == 0) || ((pSVar3->field_5).m_instrDef == (Instr *)0x0)) &&
          (bVar2 = Func::IsInPhase(callInstr->m_func,FGPeepsPhase), !bVar2)) &&
         (bVar2 = Func::IsInPhase(callInstr->m_func,FGBuildPhase), !bVar2)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *local_38 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1bf,
                           "(linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase)))"
                           ,
                           "linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase))"
                          );
        if (!bVar2) goto LAB_005038d7;
        *local_38 = 0;
      }
      if ((pSVar3->field_0x18 & 1) == 0) {
        pIVar7 = (Instr *)0x0;
      }
      else {
        pIVar7 = (pSVar3->field_5).m_instrDef;
      }
    }
    opcode = pIVar5->m_opcode;
    if (opcode != ArgOut_A_InlineSpecialized) {
      if (opcode == StartCall) {
        if (pIVar7 != (Instr *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *local_38 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                             ,0x1ce,"(nextArg == nullptr)","nextArg == nullptr");
          if (!bVar2) goto LAB_005038d7;
          *local_38 = 0;
        }
        break;
      }
      this_00 = callInstr->m_func->m_symTable;
      pSVar3 = IR::Opnd::GetStackSym(pIVar5->m_dst);
      argSlotNum = StackSym::GetArgSlotNum(pSVar3);
      pSVar3 = SymTable::GetArgSlotSym(this_00,argSlotNum);
      pSVar4 = IR::SymOpnd::New(&pSVar3->super_Sym,0,pIVar5->m_dst->m_type,callInstr->m_func);
      this_01 = IR::Instr::New(opcode,&pSVar4->super_Opnd,pIVar5->m_src1,callInstr->m_func);
      IR::Instr::SetByteCodeOffset(this_01,callInstr);
      pSVar3 = IR::Opnd::GetStackSym(this_01->m_dst);
      pSVar3->field_0x1b = pSVar3->field_0x1b | 2;
      IR::Instr::SetSrc2(local_40,this_01->m_dst);
      IR::Instr::InsertBefore(local_40,this_01);
      pIVar6 = pIVar5;
      local_40 = this_01;
    }
    pIVar5 = pIVar7;
  } while (pIVar7 != (Instr *)0x0);
  pSVar3 = IR::Opnd::GetStackSym(pIVar6->m_src2);
  if ((pSVar3->field_0x18 & 1) == 0) {
    pIVar5 = (Instr *)0x0;
  }
  else {
    pIVar5 = (pSVar3->field_5).m_instrDef;
  }
  IR::Instr::SetSrc2(local_40,pIVar5->m_dst);
  return;
}

Assistant:

void Inline::CloneCallSequence(IR::Instr* callInstr, IR::Instr* clonedCallInstr)
{
    IR::Instr* previousArg = nullptr;
    IR::Instr* previousClonedArg = clonedCallInstr;
    callInstr->IterateArgInstrs([&](IR::Instr* argInstr){
        IR::Instr* cloneArg = IR::Instr::New(argInstr->m_opcode,
            IR::SymOpnd::New(callInstr->m_func->m_symTable->GetArgSlotSym(argInstr->GetDst()->GetStackSym()->GetArgSlotNum()), 0, argInstr->GetDst()->GetType(), callInstr->m_func),
            argInstr->GetSrc1(), callInstr->m_func);
        cloneArg->SetByteCodeOffset(callInstr);
        cloneArg->GetDst()->GetStackSym()->m_isArgCaptured = true;
        previousClonedArg->SetSrc2(cloneArg->GetDst());
        previousClonedArg->InsertBefore(cloneArg);
        previousArg = argInstr;
        previousClonedArg = cloneArg;
        return false;
    });
    IR::Instr* startCall = previousArg->GetSrc2()->GetStackSym()->GetInstrDef();
    previousClonedArg->SetSrc2(startCall->GetDst());

}